

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

void Fra_SmlInitialize(Fra_Sml_t *p,int fInit)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  pAVar1 = p->pAig;
  if (fInit == 0) {
    pVVar2 = pAVar1->vCis;
    if (0 < pVVar2->nSize) {
      lVar5 = 0;
      do {
        Fra_SmlAssignRandom(p,(Aig_Obj_t *)pVVar2->pArray[lVar5]);
        lVar5 = lVar5 + 1;
        pVVar2 = p->pAig->vCis;
      } while (lVar5 < pVVar2->nSize);
    }
  }
  else {
    if (pAVar1->nRegs < 1) {
      __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x196,"void Fra_SmlInitialize(Fra_Sml_t *, int)");
    }
    if (pAVar1->nObjs[2] <= pAVar1->nRegs) {
      __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                    ,0x197,"void Fra_SmlInitialize(Fra_Sml_t *, int)");
    }
    pAVar1 = p->pAig;
    uVar3 = pAVar1->nObjs[2] - pAVar1->nRegs;
    uVar4 = (ulong)uVar3;
    if (uVar3 != 0 && pAVar1->nRegs <= pAVar1->nObjs[2]) {
      lVar5 = 0;
      do {
        if (pAVar1->vCis->nSize <= lVar5) goto LAB_00605e3c;
        Fra_SmlAssignRandom(p,(Aig_Obj_t *)pAVar1->vCis->pArray[lVar5]);
        lVar5 = lVar5 + 1;
        pAVar1 = p->pAig;
        uVar4 = (long)pAVar1->nObjs[2] - (long)pAVar1->nRegs;
      } while (lVar5 < (long)uVar4);
    }
    pVVar2 = p->pAig->vCis;
    if ((int)uVar4 < pVVar2->nSize) {
      uVar6 = uVar4 & 0xffffffff;
      do {
        if ((int)uVar4 < 0) {
LAB_00605e3c:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Fra_SmlAssignConst(p,(Aig_Obj_t *)pVVar2->pArray[uVar6],0,0);
        uVar6 = uVar6 + 1;
        pVVar2 = p->pAig->vCis;
      } while ((int)uVar6 < pVVar2->nSize);
    }
  }
  return;
}

Assistant:

void Fra_SmlInitialize( Fra_Sml_t * p, int fInit )
{
    Aig_Obj_t * pObj;
    int i;
    if ( fInit )
    {
        assert( Aig_ManRegNum(p->pAig) > 0 );
        assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
        // assign random info for primary inputs
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Fra_SmlAssignRandom( p, pObj );
        // assign the initial state for the latches
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, 0, 0 );
    }
    else
    {
        Aig_ManForEachCi( p->pAig, pObj, i )
            Fra_SmlAssignRandom( p, pObj );
    }
}